

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElementType::~IfcDistributionControlElementType
          (IfcDistributionControlElementType *this,void **vtt)

{
  void **vtt_local;
  IfcDistributionControlElementType *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElementType,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElementType,_0UL> *)
             &(this->super_IfcDistributionElementType).super_IfcElementType.field_0x190,vtt + 0x28);
  IfcDistributionElementType::~IfcDistributionElementType
            (&this->super_IfcDistributionElementType,vtt + 1);
  return;
}

Assistant:

IfcDistributionControlElementType() : Object("IfcDistributionControlElementType") {}